

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

int restincurl::RequestBuilder::debug_callback
              (CURL *handle,curl_infotype type,char *data,size_t size,void *userp)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  ostream *poVar1;
  string local_50 [8];
  string msg;
  void *userp_local;
  size_t size_local;
  char *data_local;
  curl_infotype type_local;
  CURL *handle_local;
  
  std::__cxx11::string::string(local_50);
  switch(type) {
  case CURLINFO_TEXT:
    std::__cxx11::string::operator=(local_50,"==> Info: ");
    break;
  case CURLINFO_HEADER_IN:
    std::__cxx11::string::operator=(local_50,"<= Recv header: ");
    break;
  case CURLINFO_HEADER_OUT:
    std::__cxx11::string::operator=(local_50,"=> Send header: ");
    break;
  case CURLINFO_DATA_IN:
    std::__cxx11::string::operator=(local_50,"<= Recv data: ");
    break;
  case CURLINFO_DATA_OUT:
    std::__cxx11::string::operator=(local_50,"=> Send data: ");
    break;
  case CURLINFO_SSL_DATA_IN:
    std::__cxx11::string::operator=(local_50,"<= Recv SSL data: ");
    break;
  case CURLINFO_SSL_DATA_OUT:
    std::__cxx11::string::operator=(local_50,"=> Send SSL data: ");
    break;
  case CURLINFO_END:
    std::__cxx11::string::operator=(local_50,"<= End: ");
  }
  __result = std::back_inserter<std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
  std::copy<char*,std::back_insert_iterator<std::__cxx11::string>>(data,data + size,__result);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,handle);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,local_50);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_50);
  return 0;
}

Assistant:

static int debug_callback(CURL *handle, curl_infotype type,
             char *data, size_t size,
             void *userp) {

            std::string msg;
            switch(type) {
            case CURLINFO_TEXT:
                msg = "==> Info: ";
                break;
            case CURLINFO_HEADER_OUT:
                msg =  "=> Send header: ";
                break;
            case CURLINFO_DATA_OUT:
                msg = "=> Send data: ";
                break;
            case CURLINFO_SSL_DATA_OUT:
                msg = "=> Send SSL data: ";
                break;
            case CURLINFO_HEADER_IN:
                msg = "<= Recv header: ";
                break;
            case CURLINFO_DATA_IN:
                msg = "<= Recv data: ";
                break;
            case CURLINFO_SSL_DATA_IN:
                msg = "<= Recv SSL data: ";
                break;
            case CURLINFO_END: // Don't seems to be used
                msg = "<= End: ";
                break;
            }

            std::copy(data, data + size, std::back_inserter(msg));
            RESTINCURL_LOG(handle << " " << msg);
            return 0;
        }